

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_story_dependencies.hpp
# Opt level: O2

void PatchRemoveStoryDependencies::make_gumi_boulder_push_not_story_dependant(World *world)

{
  Map *pMVar1;
  Entity *pEVar2;
  EntityType *pEVar3;
  allocator<char> local_39;
  string local_38;
  
  pMVar1 = World::map(world,0x1c1);
  pEVar2 = Map::entity(pMVar1,'\x06');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"large_thin_yellow_platform",&local_39);
  pEVar3 = World::entity_type(world,&local_38);
  (pEVar2->_attrs).type_id = pEVar3->_id;
  std::__cxx11::string::~string((string *)&local_38);
  (pEVar2->_attrs).entity_to_use_tiles_from = (Entity *)0x0;
  (pEVar2->_attrs).position.half_z = true;
  (pEVar2->_attrs).palette = '\0';
  pMVar1 = World::map(world,0x1c1);
  Map::remove_entity(pMVar1,'\x04',true);
  pMVar1 = World::map(world,0x1c1);
  pEVar2 = Map::entity(pMVar1,'\x02');
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::erase
            (&(pEVar2->_attrs).mask_flags,
             (pEVar2->_attrs).mask_flags.
             super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
             super__Vector_impl_data._M_start);
  pMVar1 = World::map(world,0x1c1);
  pEVar2 = Map::entity(pMVar1,'\x03');
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::erase
            (&(pEVar2->_attrs).mask_flags,
             (pEVar2->_attrs).mask_flags.
             super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
             super__Vector_impl_data._M_start);
  return;
}

Assistant:

static void make_gumi_boulder_push_not_story_dependant(World& world)
    {
        // Turn the last boulder into a platform to prevent any softlock
        Entity* last_boulder = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(6);
        last_boulder->entity_type_id(world.entity_type("large_thin_yellow_platform")->id());
        last_boulder->entity_to_use_tiles_from(nullptr);
        last_boulder->position().half_z = true;
        last_boulder->palette(0);

        // Always remove Pockets from Gumi boulder map
        world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->remove_entity(4);

        // Erase the first entity mask for each bear which makes them only appear under a specific scenario requirement
        std::vector<EntityMaskFlag>& first_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(2)->mask_flags();
        first_bear_masks.erase(first_bear_masks.begin());

        std::vector<EntityMaskFlag>& second_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(3)->mask_flags();
        second_bear_masks.erase(second_bear_masks.begin());
    }